

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O3

SubroutineSymbol *
slang::ast::SubroutineSymbol::fromSyntax
          (Compilation *compilation,DPIImportSyntax *syntax,Scope *parent)

{
  uint uVar1;
  byte *pbVar2;
  undefined1 *puVar3;
  TokenKind TVar4;
  FunctionPrototypeSyntax *pFVar5;
  long lVar6;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  byte bVar7;
  byte bVar8;
  pointer ppFVar9;
  underlying_type uVar10;
  bitmask<slang::ast::MethodFlags> bVar11;
  int iVar12;
  SubroutineSymbol *this;
  undefined4 extraout_var;
  FunctionPortListSyntax *extraout_RDX;
  FunctionPortListSyntax *syntax_01;
  FunctionPortListSyntax *extraout_RDX_00;
  FunctionPortListSyntax *extraout_RDX_01;
  size_t extraout_RDX_02;
  long lVar13;
  long lVar14;
  string_view sVar15;
  SourceRange sourceRange;
  SubroutineKind subroutineKind;
  SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL> arguments;
  Token nameToken;
  SubroutineKind local_a4;
  Scope *local_a0;
  Compilation *local_98;
  VariableLifetime local_8c;
  SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> local_88 [2];
  SourceLocation local_48;
  Token local_40;
  
  pFVar5 = (syntax->method).ptr;
  local_40 = slang::syntax::SyntaxNode::getLastToken((SyntaxNode *)(pFVar5->name).ptr);
  local_a4 = (SubroutineKind)((pFVar5->keyword).kind == TaskKeyword);
  local_88[0]._0_16_ = (undefined1  [16])parsing::Token::valueText(&local_40);
  local_48 = parsing::Token::location(&local_40);
  local_8c = Automatic;
  this = BumpAllocator::
         emplace<slang::ast::SubroutineSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::VariableLifetime,slang::ast::SubroutineKind&>
                   (&compilation->super_BumpAllocator,compilation,
                    (basic_string_view<char,_std::char_traits<char>_> *)local_88,&local_48,&local_8c
                    ,&local_a4);
  (this->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  syntax_00._M_ptr =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  syntax_00._M_extent._M_extent_value =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
       _M_extent_value;
  local_a0 = parent;
  Symbol::setAttributes(&this->super_Symbol,parent,syntax_00);
  (this->flags).m_bits = 0x80;
  pbVar2 = (byte *)((long)&(this->declaredReturnType).flags.m_bits + 1);
  *pbVar2 = *pbVar2 | 4;
  if (local_a4 == Function) {
    (this->declaredReturnType).typeOrLink =
         (anon_union_8_2_f12d5f64_for_typeOrLink)(pFVar5->returnType).ptr;
    puVar3 = &(this->declaredReturnType).field_0x3f;
    *puVar3 = *puVar3 & 0x7f;
  }
  else {
    (this->declaredReturnType).type = compilation->voidType;
  }
  TVar4 = (syntax->property).kind;
  if (TVar4 == PureKeyword) {
    bVar8 = 0;
    uVar10 = 0x82;
  }
  else {
    bVar8 = 1;
    if (TVar4 != ContextKeyword) goto LAB_00287fd2;
    bVar8 = 1;
    uVar10 = 0x180;
  }
  (this->flags).m_bits = uVar10;
LAB_00287fd2:
  local_98 = compilation;
  sVar15 = parsing::Token::valueText(&syntax->specString);
  if ((sVar15._M_len == 3) &&
     ((char)*(short *)((long)sVar15._M_str + 2) == 'I' && *(short *)sVar15._M_str == 0x5044)) {
    sourceRange = parsing::Token::range(&syntax->specString);
    Scope::addDiag(local_a0,(DiagCode)0xea0006,sourceRange);
  }
  local_88[0].len = 0;
  local_88[0].data_ = (pointer)((long)local_88 + 0x18);
  local_88[0].cap = 5;
  syntax_01 = pFVar5->portList;
  if (syntax_01 != (FunctionPortListSyntax *)0x0) {
    bVar11 = buildArguments(&this->super_Scope,local_a0,syntax_01,Automatic,local_88);
    (this->flags).m_bits = (this->flags).m_bits | bVar11.m_bits;
    syntax_01 = extraout_RDX;
    if ((char *)local_88[0].len != (char *)0x0) {
      ppFVar9 = local_88[0].data_;
      lVar13 = local_88[0].len << 3;
      lVar14 = 0;
      bVar7 = 0;
      do {
        lVar6 = *(long *)((long)ppFVar9 + lVar14);
        *(uint *)(lVar6 + 0x78) = *(uint *)(lVar6 + 0x78) | 0x800;
        uVar1 = *(int *)(lVar6 + 0x158) - 1;
        syntax_01 = (FunctionPortListSyntax *)(ulong)uVar1;
        if (uVar1 < 2) {
          if (!(bool)(bVar8 | bVar7)) {
            bVar7 = 1;
            Scope::addDiag(local_a0,(DiagCode)0x250006,*(SourceLocation *)(lVar6 + 0x18));
            syntax_01 = extraout_RDX_00;
          }
        }
        else if (*(int *)(lVar6 + 0x158) == 3) {
          Scope::addDiag(local_a0,(DiagCode)0x270006,*(SourceLocation *)(lVar6 + 0x18));
          syntax_01 = extraout_RDX_01;
        }
        lVar14 = lVar14 + 8;
      } while (lVar13 != lVar14);
    }
  }
  iVar12 = SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>::copy
                     (local_88,(EVP_PKEY_CTX *)local_98,(EVP_PKEY_CTX *)syntax_01);
  (this->arguments)._M_ptr = (pointer)CONCAT44(extraout_var,iVar12);
  (this->arguments)._M_extent._M_extent_value = extraout_RDX_02;
  if (local_88[0].data_ != (pointer)((long)local_88 + 0x18U)) {
    operator_delete(local_88[0].data_);
  }
  return this;
}

Assistant:

SubroutineSymbol& SubroutineSymbol::fromSyntax(Compilation& compilation,
                                               const DPIImportSyntax& syntax, const Scope& parent) {
    auto& proto = *syntax.method;
    Token nameToken = proto.name->getLastToken();
    auto subroutineKind = proto.keyword.kind == TokenKind::TaskKeyword ? SubroutineKind::Task
                                                                       : SubroutineKind::Function;

    auto result = compilation.emplace<SubroutineSymbol>(compilation, nameToken.valueText(),
                                                        nameToken.location(),
                                                        VariableLifetime::Automatic,
                                                        subroutineKind);
    result->setSyntax(syntax);
    result->setAttributes(parent, syntax.attributes);
    result->flags = MethodFlags::DPIImport;

    result->declaredReturnType.addFlags(DeclaredTypeFlags::DPIReturnType);
    if (subroutineKind == SubroutineKind::Function)
        result->declaredReturnType.setTypeSyntax(*proto.returnType);
    else
        result->declaredReturnType.setType(compilation.getVoidType());

    bool isPure = false;
    switch (syntax.property.kind) {
        case TokenKind::PureKeyword:
            isPure = true;
            result->flags |= MethodFlags::Pure;
            break;
        case TokenKind::ContextKeyword:
            result->flags |= MethodFlags::DPIContext;
            break;
        default:
            break;
    }

    if (syntax.specString.valueText() == "DPI")
        parent.addDiag(diag::DPISpecDisallowed, syntax.specString.range());

    SmallVector<const FormalArgumentSymbol*> arguments;
    if (proto.portList) {
        result->flags |= SubroutineSymbol::buildArguments(*result, parent, *proto.portList,
                                                          VariableLifetime::Automatic, arguments);
    }

    // Check arguments for extra rules imposed by DPI imports.
    bool pureError = false;
    for (auto arg : arguments) {
        const_cast<FormalArgumentSymbol*>(arg)->getDeclaredType()->addFlags(
            DeclaredTypeFlags::DPIArg);

        if (arg->direction == ArgumentDirection::Ref)
            parent.addDiag(diag::DPIRefArg, arg->location);
        else if (arg->direction == ArgumentDirection::Out ||
                 arg->direction == ArgumentDirection::InOut) {
            if (isPure && !pureError) {
                parent.addDiag(diag::DPIPureArg, arg->location);
                pureError = true;
            }
        }
    }

    result->arguments = arguments.copy(compilation);
    return *result;
}